

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::CurrencyPluralInfo::getCurrencyPluralPattern
          (CurrencyPluralInfo *this,UnicodeString *pluralCount,UnicodeString *result)

{
  short sVar1;
  Hashtable *pHVar2;
  int8_t iVar3;
  UnicodeString *src;
  int32_t length;
  ConstChar16Ptr local_88;
  char16_t *local_80;
  undefined1 *local_70;
  UnicodeString local_60;
  
  src = (UnicodeString *)uhash_get_63(this->fPluralCountToCurrencyUnitPattern->hash,pluralCount);
  if (src == (UnicodeString *)0x0) {
    sVar1 = (pluralCount->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (pluralCount->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    iVar3 = UnicodeString::doCompare(pluralCount,0,length,(UChar *)gPluralCountOther,0,5);
    local_70 = gPluralCountOther;
    if (iVar3 != '\0') {
      pHVar2 = this->fPluralCountToCurrencyUnitPattern;
      local_88.p_ = (char16_t *)gPluralCountOther;
      UnicodeString::UnicodeString(&local_60,'\x01',&local_88,5);
      src = (UnicodeString *)uhash_get_63(pHVar2->hash,&local_60);
      UnicodeString::~UnicodeString(&local_60);
      local_80 = local_88.p_;
      if (src != (UnicodeString *)0x0) goto LAB_0028b34c;
    }
    UnicodeString::UnicodeString(&local_60,(UChar *)gDefaultCurrencyPluralPattern);
    UnicodeString::moveFrom(result,&local_60);
    UnicodeString::~UnicodeString(&local_60);
  }
  else {
LAB_0028b34c:
    UnicodeString::operator=(result,src);
  }
  return result;
}

Assistant:

UnicodeString&
CurrencyPluralInfo::getCurrencyPluralPattern(const UnicodeString&  pluralCount,
                                             UnicodeString& result) const {
    const UnicodeString* currencyPluralPattern = 
        (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(pluralCount);
    if (currencyPluralPattern == nullptr) {
        // fall back to "other"
        if (pluralCount.compare(gPluralCountOther, 5)) {
            currencyPluralPattern = 
                (UnicodeString*)fPluralCountToCurrencyUnitPattern->get(UnicodeString(TRUE, gPluralCountOther, 5));
        }
        if (currencyPluralPattern == nullptr) {
            // no currencyUnitPatterns defined, 
            // fallback to predefined default.
            // This should never happen when ICU resource files are
            // available, since currencyUnitPattern of "other" is always
            // defined in root.
            result = UnicodeString(gDefaultCurrencyPluralPattern);
            return result;
        }
    }
    result = *currencyPluralPattern;
    return result;
}